

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_container_offset
               (array_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  uint size;
  array_container_t *paVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int32_t lenarray;
  
  lenarray = c->cardinality;
  size = count_less(c->array,lenarray,-offset);
  if (size != 0 && loc != (container_t **)0x0) {
    paVar1 = array_container_create_given_capacity(size);
    uVar2 = 0;
    uVar4 = 0;
    if (0 < (int)size) {
      uVar4 = (ulong)size;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      array_container_add(paVar1,c->array[uVar2] + offset);
    }
    *loc = paVar1;
    lenarray = c->cardinality;
  }
  if (lenarray - size != 0 && hic != (container_t **)0x0) {
    paVar1 = array_container_create_given_capacity(lenarray - size);
    for (lVar3 = (long)(int)size; lVar3 < c->cardinality; lVar3 = lVar3 + 1) {
      array_container_add(paVar1,c->array[lVar3] + offset);
    }
    *hic = paVar1;
  }
  return;
}

Assistant:

void array_container_offset(const array_container_t *c, container_t **loc,
                            container_t **hic, uint16_t offset) {
    array_container_t *lo = NULL, *hi = NULL;
    int top, lo_cap, hi_cap;

    top = (1 << 16) - offset;

    lo_cap = count_less(c->array, c->cardinality, top);
    if (loc && lo_cap) {
        lo = array_container_create_given_capacity(lo_cap);
        for (int i = 0; i < lo_cap; ++i) {
            array_container_add(lo, c->array[i] + offset);
        }
        *loc = (container_t *)lo;
    }

    hi_cap = c->cardinality - lo_cap;
    if (hic && hi_cap) {
        hi = array_container_create_given_capacity(hi_cap);
        for (int i = lo_cap; i < c->cardinality; ++i) {
            array_container_add(hi, c->array[i] + offset);
        }
        *hic = (container_t *)hi;
    }
}